

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall QToolBarAreaLayoutLine::fitLayout(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *this_00;
  Orientation OVar1;
  bool bVar2;
  int iVar3;
  QSize QVar4;
  pointer pQVar5;
  undefined4 extraout_var;
  QLayout *object;
  QToolBarLayout *this_01;
  ulong uVar6;
  QSize QVar7;
  Representation RVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  ulong local_48;
  
  OVar1 = this->o;
  QVar4 = minimumSize(this);
  QVar7 = (QSize)((ulong)QVar4 >> 0x20);
  if (OVar1 == Horizontal) {
    QVar7 = QVar4;
  }
  OVar1 = this->o;
  QVar4 = QRect::size(&this->rect);
  RVar8 = QVar4.ht.m_i;
  if (OVar1 == Horizontal) {
    RVar8 = QVar4.wd.m_i;
  }
  uVar12 = RVar8.m_i - QVar7.wd.m_i;
  uVar10 = 0;
  uVar13 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar13 = uVar10;
  }
  local_48 = 0xffffffff;
  for (uVar14 = 0; uVar6 = (this->toolBarItems).d.size, uVar14 < uVar6; uVar14 = uVar14 + 1) {
    pQVar5 = QList<QToolBarAreaLayoutItem>::data(&this->toolBarItems);
    this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar5->widgetItem + uVar10);
    bVar2 = QToolBarAreaLayoutItem::skip(this_00);
    if (!bVar2) {
      iVar3 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
      object = QWidget::layout((QWidget *)CONCAT44(extraout_var,iVar3));
      this_01 = QtPrivate::qobject_cast_helper<QToolBarLayout*,QObject>(&object->super_QObject);
      if (this_01 != (QToolBarLayout *)0x0) {
        QToolBarLayout::checkUsePopupMenu(this_01);
      }
      OVar1 = this->o;
      QVar4 = QToolBarAreaLayoutItem::minimumSize(this_00);
      QVar7 = (QSize)((ulong)QVar4 >> 0x20);
      if (OVar1 == Horizontal) {
        QVar7 = QVar4;
      }
      RVar8.m_i = *(int *)((long)&pQVar5->preferredSize + uVar10);
      if (RVar8.m_i < 1) {
        OVar1 = this->o;
        QVar4 = QToolBarAreaLayoutItem::sizeHint(this_00);
        RVar8.m_i = QVar4.ht.m_i.m_i;
        if (OVar1 == Horizontal) {
          RVar8.m_i = QVar4.wd.m_i.m_i;
        }
      }
      iVar3 = RVar8.m_i - QVar7.wd.m_i;
      iVar9 = (int)uVar13;
      if (iVar9 <= iVar3) {
        iVar3 = iVar9;
      }
      *(int *)((long)&pQVar5->size + uVar10) = QVar7.wd.m_i.m_i + iVar3;
      uVar13 = (ulong)(uint)(iVar9 - iVar3);
      local_48 = uVar14 & 0xffffffff;
    }
    uVar10 = uVar10 + 0x18;
  }
  lVar11 = 0;
  iVar3 = 0;
  for (uVar13 = 0; uVar13 < uVar6; uVar13 = uVar13 + 1) {
    pQVar5 = QList<QToolBarAreaLayoutItem>::data(&this->toolBarItems);
    bVar2 = QToolBarAreaLayoutItem::skip
                      ((QToolBarAreaLayoutItem *)((long)&pQVar5->widgetItem + lVar11));
    if (!bVar2) {
      *(int *)((long)&pQVar5->pos + lVar11) = iVar3;
      if (local_48 == uVar13) {
        OVar1 = this->o;
        QVar7 = QRect::size(&this->rect);
        RVar8 = QVar7.ht.m_i;
        if (OVar1 == Horizontal) {
          RVar8 = QVar7.wd.m_i;
        }
        iVar9 = RVar8.m_i - *(int *)((long)&pQVar5->pos + lVar11);
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        *(int *)((long)&pQVar5->size + lVar11) = iVar9;
      }
      else {
        iVar9 = *(int *)((long)&pQVar5->size + lVar11);
      }
      iVar3 = iVar9 + iVar3;
    }
    uVar6 = (this->toolBarItems).d.size;
    lVar11 = lVar11 + 0x18;
  }
  return;
}

Assistant:

void QToolBarAreaLayoutLine::fitLayout()
{
    int last = -1;
    int min = pick(o, minimumSize());
    int space = pick(o, rect.size());
    int extra = qMax(0, space - min);

    for (int i = 0; i < toolBarItems.size(); ++i) {
        QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        if (QToolBarLayout *tblayout = qobject_cast<QToolBarLayout*>(item.widgetItem->widget()->layout()))
            tblayout->checkUsePopupMenu();

        const int itemMin = pick(o, item.minimumSize());
        //preferredSize is the default if it is set, otherwise, we take the sizehint
        item.size = item.preferredSize > 0 ? item.preferredSize : pick(o, item.sizeHint());

        //the extraspace is the space above the item minimum sizehint
        const int extraSpace = qMin(item.size - itemMin, extra);
        item.size = itemMin + extraSpace; //that is the real size

        extra -= extraSpace;

        last = i;
    }

    // calculate the positions from the sizes
    int pos = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        item.pos = pos;
        if (i == last) // stretch the last item to the end of the line
            item.size = qMax(0, pick(o, rect.size()) - item.pos);
        pos += item.size;
    }
}